

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O0

factor * __thiscall merlin::factor::normalize(factor *this)

{
  value B;
  double Z;
  factor *this_local;
  
  B = sum(this);
  if ((B != 0.0) || (NAN(B))) {
    operator/=(this,B);
  }
  return this;
}

Assistant:

factor& normalize() {
		double Z = sum();
		if (Z != 0)
			*this /= Z;
		return *this;
	}